

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::ArenaStringPtr::Set
          (ArenaStringPtr *this,string *default_value,ConstStringParam value,Arena *arena)

{
  string *psVar1;
  pointer pcVar2;
  string *psVar3;
  
  psVar1 = (string *)(this->tagged_ptr_).ptr_;
  if (psVar1 != default_value) {
    std::__cxx11::string::_M_replace
              ((ulong)psVar1,0,(char *)psVar1->_M_string_length,(ulong)(value->_M_dataplus)._M_p);
    return;
  }
  if (arena == (Arena *)0x0) {
    psVar3 = (string *)operator_new(0x20);
    *(string **)psVar3 = psVar3 + 0x10;
    pcVar2 = (value->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>(psVar3,pcVar2,pcVar2 + value->_M_string_length);
  }
  else {
    if (((byte)arena[0x18] & 1) != 0) {
      Set((ArenaStringPtr *)arena);
    }
    psVar3 = (string *)
             ArenaImpl::AllocateAlignedAndAddCleanup
                       ((ArenaImpl *)arena,0x20,arena_destruct_object<std::__cxx11::string>);
    *(string **)psVar3 = psVar3 + 0x10;
    pcVar2 = (value->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>(psVar3,pcVar2,pcVar2 + value->_M_string_length);
  }
  (this->tagged_ptr_).ptr_ = psVar3;
  return;
}

Assistant:

void ArenaStringPtr::Set(const std::string* default_value,
                         ConstStringParam value, ::google::protobuf::Arena* arena) {
  if (IsDefault(default_value)) {
    tagged_ptr_.Set(Arena::Create<std::string>(arena, value));
  } else {
    UnsafeMutablePointer()->assign(value.data(), value.length());
  }
}